

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

void __thiscall Mustache::Renderer::setError(Renderer *this,QString *error,int pos)

{
  bool bVar1;
  QString *pQVar2;
  int pos_local;
  QString *error_local;
  Renderer *this_local;
  
  QString::operator=(&this->m_error,(QString *)error);
  this->m_errorPos = pos;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)this);
  if (!bVar1) {
    pQVar2 = QStack<QString>::top(&this->m_partialStack);
    QString::operator=(&this->m_errorPartial,(QString *)pQVar2);
  }
  return;
}

Assistant:

void Renderer::setError(const QString& error, int pos)
{
	Q_ASSERT(!error.isEmpty());
	Q_ASSERT(pos >= 0);

	m_error = error;
	m_errorPos = pos;

	if (!m_partialStack.isEmpty())
	{
		m_errorPartial = m_partialStack.top();
	}
}